

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value,
          optional_idx *default_value)

{
  idx_t iVar1;
  optional_idx local_18;
  
  if (((this->options).serialize_default_values == false) && (value->index == default_value->index))
  {
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
    (*this->_vptr_Serializer[5])(this,0);
    return;
  }
  (*this->_vptr_Serializer[4])(this,field_id,tag,1);
  local_18 = (optional_idx)value->index;
  if (local_18.index == 0xffffffffffffffff) {
    iVar1 = 0xffffffffffffffff;
  }
  else {
    iVar1 = optional_idx::GetIndex(&local_18);
  }
  (*this->_vptr_Serializer[0x15])(this,iVar1);
  (*this->_vptr_Serializer[5])(this,1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}